

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O2

void __thiscall QTextEdit::timerEvent(QTextEdit *this,QTimerEvent *e)

{
  long lVar1;
  QPoint QVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  QWidget *parent;
  QPoint QVar6;
  undefined8 uVar7;
  uint uVar8;
  int iVar9;
  Representation RVar10;
  Representation RVar11;
  uint uVar12;
  uint uVar13;
  Representation RVar14;
  long in_FS_OFFSET;
  QRect QVar15;
  QArrayDataPointer<char16_t> local_e8;
  undefined1 local_c8 [16];
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  QMouseEvent ev;
  QPoint local_48;
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  if (*(int *)(e + 0x10) == *(int *)(lVar1 + 0x308)) {
    QVar15 = QWidget::rect(*(QWidget **)(lVar1 + 0x2b0));
    if ((*(byte *)(lVar1 + 800) & 8) == 0) {
      local_48 = (QPoint)QCursor::pos();
      local_40 = QWidget::mapFromGlobal(*(QWidget **)(lVar1 + 0x2b0),&local_48);
      _ev = &DAT_aaaaaaaaaaaaaaaa;
      local_a8 = (double)local_40.xp.m_i.m_i;
      local_a0 = (double)local_40.yp.m_i.m_i;
      parent = QWidget::window((QWidget *)this);
      QVar6 = QWidget::mapTo((QWidget *)this,parent,&local_40);
      local_b8 = (double)QVar6.xp.m_i.m_i;
      local_b0 = (double)QVar6.yp.m_i.m_i;
      local_c8._8_4_ = SUB84((double)local_48.yp.m_i.m_i,0);
      local_c8._0_8_ = (double)local_48.xp.m_i.m_i;
      local_c8._12_4_ = (int)((ulong)(double)local_48.yp.m_i.m_i >> 0x20);
      local_e8.d = (Data *)0x0;
      local_e8.ptr = (char16_t *)0x0;
      local_e8.size = 0;
      uVar7 = QPointingDevice::primaryPointingDevice((QString *)&local_e8);
      QMouseEvent::QMouseEvent(&ev,5,&local_a8,&local_b8,local_c8,1,1,0,uVar7);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
      (**(code **)(*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0xb0))
                (this,&ev);
      QMouseEvent::~QMouseEvent(&ev);
      QVar6 = (QPoint)((ulong)local_40 & 0xffffffff);
      QVar2 = local_40;
    }
    else {
      QVar6 = *(QPoint *)(lVar1 + 0x30c);
      RVar10 = QVar15.x2.m_i;
      RVar14 = QVar15.x1.m_i;
      iVar4 = ((RVar10.m_i - RVar14.m_i) + 1) / 3;
      if (0x13 < iVar4) {
        iVar4 = 0x14;
      }
      RVar11 = QVar15.y2.m_i;
      iVar3 = ((RVar11.m_i - QVar15.y1.m_i) + 1) / 3;
      iVar9 = 0x14;
      if (iVar3 < 0x14) {
        iVar9 = iVar3;
      }
      QVar15.y1.m_i = QVar15.y1.m_i.m_i + iVar9;
      QVar15.x1.m_i = iVar4 + RVar14.m_i;
      QVar15.y2.m_i = RVar11.m_i - iVar9;
      QVar15.x2.m_i = RVar10.m_i - iVar4;
      local_40.yp = QVar6.yp.m_i;
      QVar2 = QVar6;
    }
    local_40 = QVar2;
    iVar9 = QVar15.y2.m_i.m_i - local_40.yp.m_i;
    iVar4 = local_40.yp.m_i - QVar15.y1.m_i;
    if (iVar4 <= iVar9) {
      iVar4 = iVar9;
    }
    uVar13 = ~QVar15.y2.m_i.m_i + QVar15.y1.m_i.m_i + iVar4;
    RVar10 = QVar15.x2.m_i;
    iVar9 = RVar10.m_i - QVar6.xp.m_i;
    RVar14 = QVar15.x1.m_i;
    iVar4 = QVar6.xp.m_i.m_i - RVar14.m_i;
    if (iVar4 <= iVar9) {
      iVar4 = iVar9;
    }
    uVar12 = ~RVar10.m_i + RVar14.m_i + iVar4;
    uVar5 = uVar13;
    if ((int)uVar13 < (int)uVar12) {
      uVar5 = uVar12;
    }
    if (-1 < (int)uVar5) {
      uVar8 = 7;
      if (7 < uVar5) {
        uVar8 = uVar5;
      }
      QBasicTimer::start((QBasicTimer *)(lVar1 + 0x308),(int)(0x1324 / (ulong)(uVar8 * uVar8)),
                         (QObject *)this);
      if (0 < (int)uVar13) {
        QAbstractSlider::triggerAction
                  (*(QAbstractSlider **)(lVar1 + 0x290),
                   (local_40.yp.m_i < (int)(((QVar15._8_8_ >> 0x20) + (QVar15._0_8_ >> 0x20)) / 2))
                   + SliderSingleStepAdd);
      }
      if (0 < (int)uVar12) {
        QAbstractSlider::triggerAction
                  (*(QAbstractSlider **)(lVar1 + 0x288),
                   (local_40.xp.m_i < (int)(((long)RVar10.m_i + (long)RVar14.m_i) / 2)) +
                   SliderSingleStepAdd);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEdit::timerEvent(QTimerEvent *e)
{
    Q_D(QTextEdit);
    if (e->timerId() == d->autoScrollTimer.timerId()) {
        QRect visible = d->viewport->rect();
        QPoint pos;
        if (d->inDrag) {
            pos = d->autoScrollDragPos;
            visible.adjust(qMin(visible.width()/3,20), qMin(visible.height()/3,20),
                           -qMin(visible.width()/3,20), -qMin(visible.height()/3,20));
        } else {
            const QPoint globalPos = QCursor::pos();
            pos = d->viewport->mapFromGlobal(globalPos);
            QMouseEvent ev(QEvent::MouseMove, pos, mapTo(topLevelWidget(), pos), globalPos, Qt::LeftButton, Qt::LeftButton, Qt::NoModifier);
            mouseMoveEvent(&ev);
        }
        int deltaY = qMax(pos.y() - visible.top(), visible.bottom() - pos.y()) - visible.height();
        int deltaX = qMax(pos.x() - visible.left(), visible.right() - pos.x()) - visible.width();
        int delta = qMax(deltaX, deltaY);
        if (delta >= 0) {
            if (delta < 7)
                delta = 7;
            int timeout = 4900 / (delta * delta);
            d->autoScrollTimer.start(timeout, this);

            if (deltaY > 0)
                d->vbar->triggerAction(pos.y() < visible.center().y() ?
                                       QAbstractSlider::SliderSingleStepSub
                                       : QAbstractSlider::SliderSingleStepAdd);
            if (deltaX > 0)
                d->hbar->triggerAction(pos.x() < visible.center().x() ?
                                       QAbstractSlider::SliderSingleStepSub
                                       : QAbstractSlider::SliderSingleStepAdd);
        }
    }
#ifdef QT_KEYPAD_NAVIGATION
    else if (e->timerId() == d->deleteAllTimer.timerId()) {
        d->deleteAllTimer.stop();
        clear();
    }
#endif
}